

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O3

bool __thiscall Minisat::BoolOption::parse(BoolOption *this,char *str)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  char cVar6;
  char *span;
  char *__s1;
  
  if (*str != '-') {
    return false;
  }
  __s1 = str + 1;
  lVar5 = 1;
  cVar3 = 'n';
  do {
    cVar6 = cVar3;
    cVar2 = str[lVar5];
    if (cVar2 != cVar6) goto LAB_00106b2c;
    pcVar1 = "no-" + lVar5;
    lVar5 = lVar5 + 1;
    cVar3 = *pcVar1;
  } while (lVar5 != 4);
  __s1 = str + 4;
LAB_00106b2c:
  iVar4 = strcmp(__s1,(this->super_Option).name);
  if (iVar4 == 0) {
    this->value = cVar2 != cVar6;
  }
  return iVar4 == 0;
}

Assistant:

static bool match(B& in, const char* str) {
    int i;
    for (i = 0; str[i] != '\0'; i++)
        if (in[i] != str[i])
            return false;

    in += i;

    return true; 
}